

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

SpikesConsumer * __thiscall
AbstractModuleClient::subscribeSpikeData
          (AbstractModuleClient *this,size_t buffersize,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ntrodes)

{
  SubType SVar1;
  network_pimpl *this_00;
  bool bVar2;
  SpikesConsumer *this_01;
  NTrodeObj *nt;
  pointer this_02;
  ulong uVar3;
  long lVar4;
  HFParsingInfo parseinfo;
  HighFreqDataType dt;
  allocator local_4a9;
  size_t local_4a8;
  vector<NTrodeObj,_std::allocator<NTrodeObj>_> local_4a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  HFSubSockSettings local_470;
  HFParsingInfo local_3c8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  HFParsingInfo local_2c8;
  HighFreqDataType local_288;
  HighFreqDataType local_1f8;
  HighFreqDataType local_168;
  HFSubSockSettings local_d8;
  
  std::__cxx11::string::string((string *)&local_2e8,"spikestream",(allocator *)&local_470);
  std::__cxx11::string::string((string *)&local_308,"Trodes",(allocator *)&local_288);
  bVar2 = MlmWrap::isHfTypeCurrentlySubbed(&this->super_MlmWrap,&local_2e8,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_328,"spikestream",(allocator *)&local_470);
    std::__cxx11::string::string((string *)&local_348,"Trodes",(allocator *)&local_288);
    this_01 = (SpikesConsumer *)MlmWrap::getHfSubObject(&this->super_MlmWrap,&local_328,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_328);
  }
  else {
    this_00 = (this->super_MlmWrap).state;
    std::__cxx11::string::string((string *)&local_470,"spikestream",(allocator *)&local_4a0);
    std::__cxx11::string::string((string *)&local_3c8,"Trodes",&local_4a9);
    network_pimpl::find_hfdt(&local_288,this_00,(string *)&local_470,(string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_470);
    bVar2 = HighFreqDataType::isValid(&local_288);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_488,ntrodes);
      HighFreqDataType::getDataFormat_abi_cxx11_(&local_388,&local_288);
      MlmWrap::createSpikesParsingInfo(&local_3c8,&this->super_MlmWrap,&local_488,&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_488);
      MlmWrap::getTrodesConfig((TrodesConfig *)&local_470,&this->super_MlmWrap);
      local_4a8 = buffersize;
      TrodesConfig::getNTrodes(&local_4a0,(TrodesConfig *)&local_470);
      TrodesConfig::~TrodesConfig((TrodesConfig *)&local_470);
      uVar3 = 0;
      for (this_02 = local_4a0.super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
                     super__Vector_impl_data._M_start;
          this_02 !=
          local_4a0.super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
          super__Vector_impl_data._M_finish; this_02 = this_02 + 1) {
        NTrodeObj::getHw_chans((vector<int,_std::allocator<int>_> *)&local_470,this_02);
        lVar4 = (long)local_470.dataType.name._M_dataplus._M_p -
                (long)local_470.dataType.super_NetworkDataType._vptr_NetworkDataType;
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_470);
        if (uVar3 < (ulong)(lVar4 >> 2)) {
          NTrodeObj::getHw_chans((vector<int,_std::allocator<int>_> *)&local_470,this_02);
          uVar3 = (long)local_470.dataType.name._M_dataplus._M_p -
                  (long)local_470.dataType.super_NetworkDataType._vptr_NetworkDataType >> 2;
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&local_470);
        }
      }
      std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector(&local_4a0);
      this_01 = (SpikesConsumer *)operator_new(0x420);
      HighFreqDataType::HighFreqDataType(&local_168,&local_288);
      HFParsingInfo::HFParsingInfo(&local_2c8,&local_3c8);
      SpikesConsumer::SpikesConsumer(this_01,&local_168,(int)local_4a8,&local_2c8,(int)uVar3 * 0x28)
      ;
      HFParsingInfo::~HFParsingInfo(&local_2c8);
      HighFreqDataType::~HighFreqDataType(&local_168);
      HighFreqDataType::HighFreqDataType(&local_1f8,&local_288);
      SVar1 = (this_01->super_HFSubConsumer).super_HighFreqSub.sockType;
      HighFreqDataType::HighFreqDataType(&local_470.dataType,&local_1f8);
      local_470.userFoo = (hfs_data_callback_fn)0x0;
      local_470.args = (void *)0x0;
      local_470.subSockType = SVar1;
      HighFreqDataType::~HighFreqDataType(&local_1f8);
      MlmWrap::addSubToList(&this->super_MlmWrap,(HighFreqSub *)this_01);
      HFSubSockSettings::HFSubSockSettings(&local_d8,&local_470);
      MlmWrap::addHfTypeToSubbedList(&this->super_MlmWrap,&local_d8);
      HighFreqDataType::~HighFreqDataType(&local_d8.dataType);
      HighFreqDataType::~HighFreqDataType(&local_470.dataType);
      HFParsingInfo::~HFParsingInfo(&local_3c8);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_368,"Spikes data could not be found on the network!",
                 (allocator *)&local_3c8);
      MlmWrap::error((string *)&local_470,&this->super_MlmWrap,&local_368);
      std::operator<<((ostream *)&std::cerr,(string *)&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_368);
      this_01 = (SpikesConsumer *)0x0;
    }
    HighFreqDataType::~HighFreqDataType(&local_288);
  }
  return this_01;
}

Assistant:

SpikesConsumer* AbstractModuleClient::subscribeSpikeData(size_t buffersize, std::vector<std::string> ntrodes){
    if(isHfTypeCurrentlySubbed(hfType_SPIKE, TRODES_NETWORK_ID)){
        return (SpikesConsumer*)getHfSubObject(hfType_SPIKE, TRODES_NETWORK_ID);
    }
    HighFreqDataType dt = state->find_hfdt(hfType_SPIKE, TRODES_NETWORK_ID);
    if(!dt.isValid()){
        std::cerr << error("Spikes data could not be found on the network!");
        return NULL;
    }
    HFParsingInfo parseinfo = createSpikesParsingInfo(ntrodes, dt.getDataFormat());
    size_t max_nchans = 0;
    for(auto const& nt : getTrodesConfig().getNTrodes()){
        if(nt.getHw_chans().size() > max_nchans){
            max_nchans = nt.getHw_chans().size();
        }
    }
    SpikesConsumer* newsub = new SpikesConsumer(dt, buffersize, parseinfo, max_nchans*POINTS_IN_WAVE);
    HFSubSockSettings sockinfo(dt, newsub->getSubSockType(), NULL, NULL);
    addSubToList(newsub);
    addHfTypeToSubbedList(sockinfo);
    return newsub;
}